

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https.c
# Opt level: O0

int http_open(HTTP_INFO *hi,char *url)

{
  int iVar1;
  size_t sVar2;
  socklen_t local_550;
  int local_54c;
  socklen_t slen;
  int opt;
  int ret;
  int verify;
  int https;
  int sock_fd;
  char dir [1024];
  char port [10];
  char host [256];
  char *url_local;
  HTTP_INFO *hi_local;
  
  if (hi == (HTTP_INFO *)0x0) {
    return -1;
  }
  opt = (int)(hi->tls).verify;
  parse_url(url,&ret,port + 2,dir + 0x3fe,(char *)&https);
  if ((((hi->tls).ssl_fd.fd != -1) && ((uint)(hi->url).https == ret)) &&
     (iVar1 = strcmp((hi->url).host,port + 2), iVar1 == 0)) {
    iVar1 = strcmp((hi->url).port,dir + 0x3fe);
    if (iVar1 == 0) {
      verify = (hi->tls).ssl_fd.fd;
      local_550 = 4;
      iVar1 = getsockopt(verify,1,4,&local_54c,&local_550);
      if ((iVar1 < 0) || (0 < local_54c)) {
        https_close(hi);
        https_init(hi,(BOOL)ret,(BOOL)opt);
        slen = https_connect(hi,port + 2,dir + 0x3fe);
        if ((int)slen < 0) {
          https_close(hi);
          _error = slen;
          return -1;
        }
      }
      goto LAB_00111561;
    }
  }
  if ((hi->tls).ssl_fd.fd != -1) {
    https_close(hi);
  }
  https_init(hi,(BOOL)ret,(BOOL)opt);
  slen = https_connect(hi,port + 2,dir + 0x3fe);
  if ((int)slen < 0) {
    https_close(hi);
    _error = slen;
    return -1;
  }
LAB_00111561:
  sVar2 = strlen(port + 2);
  strncpy((hi->url).host,port + 2,sVar2);
  sVar2 = strlen(dir + 0x3fe);
  strncpy((hi->url).port,dir + 0x3fe,sVar2);
  sVar2 = strlen((char *)&https);
  strncpy((hi->url).path,(char *)&https,sVar2);
  return 0;
}

Assistant:

int http_open(HTTP_INFO *hi, char *url)
{
    char        host[256], port[10], dir[1024];
    int         sock_fd, https, verify;
    int         ret, opt;
    socklen_t   slen;


    if (NULL == hi) return -1;

    verify = hi->tls.verify;

    parse_url(url, &https, host, port, dir);

    if ((hi->tls.ssl_fd.fd == -1) || (hi->url.https != https) ||
        (strcmp(hi->url.host, host) != 0) || (strcmp(hi->url.port, port) != 0))
    {
        if (hi->tls.ssl_fd.fd != -1)
            https_close(hi);

        https_init(hi, https, verify);

        if ((ret = https_connect(hi, host, port)) < 0)
        {
            https_close(hi);

            _error = ret;

            return -1;
        }
    }
    else
    {
        sock_fd = hi->tls.ssl_fd.fd;

        slen = sizeof(int);

        if ((getsockopt(sock_fd, SOL_SOCKET, SO_ERROR, (void *) &opt, &slen) < 0) || (opt > 0))
        {
            https_close(hi);

            https_init(hi, https, verify);

            if ((ret = https_connect(hi, host, port)) < 0)
            {
                https_close(hi);

                _error = ret;

                return -1;
            }
        }
//      else
//          printf("socket reuse: %d \n", sock_fd);
    }

    strncpy(hi->url.host, host, strlen(host));
    strncpy(hi->url.port, port, strlen(port));
    strncpy(hi->url.path, dir, strlen(dir));

    return 0;
}